

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::EmmyDebuggerManager(EmmyDebuggerManager *this)

{
  EmmyDebuggerManager *this_local;
  
  std::make_shared<HookStateBreak>();
  std::make_shared<HookStateStepOver>();
  std::make_shared<HookStateStepIn>();
  std::make_shared<HookStateStepOut>();
  std::make_shared<HookStateContinue>();
  std::make_shared<HookStateStop>();
  std::__cxx11::string::string((string *)&this->helperCode);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->extNames);
  ExtensionPoint::ExtensionPoint(&this->extension);
  std::mutex::mutex(&this->debuggerMtx);
  std::
  map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
  ::map(&this->debuggers);
  std::mutex::mutex(&this->breakDebuggerMtx);
  std::shared_ptr<Debugger>::shared_ptr(&this->hitDebugger);
  std::mutex::mutex(&this->breakpointsMtx);
  std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::vector
            (&this->breakpoints);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->lineSet);
  std::atomic<bool>::atomic(&this->isRunning,false);
  return;
}

Assistant:

EmmyDebuggerManager::EmmyDebuggerManager()
	: stateBreak(std::make_shared<HookStateBreak>()),
      stateStepOver(std::make_shared<HookStateStepOver>()),
      stateStepIn(std::make_shared<HookStateStepIn>()),
      stateStepOut(std::make_shared<HookStateStepOut>()),
	  stateContinue(std::make_shared<HookStateContinue>()),
	  stateStop(std::make_shared<HookStateStop>()),

	  isRunning(false)
{
}